

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void MeCab::replace_string(string *s,string *src,string *dst)

{
  ulong uVar1;
  string *psVar2;
  ulong in_RSI;
  string *in_RDI;
  size_type pos;
  
  uVar1 = std::__cxx11::string::find(in_RDI,in_RSI);
  if (uVar1 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)in_RDI,uVar1,psVar2);
  }
  return;
}

Assistant:

void replace_string(std::string *s,
                    const std::string &src,
                    const std::string &dst) {
  const std::string::size_type pos = s->find(src);
  if (pos != std::string::npos) {
    s->replace(pos, src.size(), dst);
  }
}